

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O3

UBool uhash_equalsScriptSet_63(UElement key1,UElement key2)

{
  ulong uVar1;
  ulong uVar2;
  
  if (*key1.pointer != *key2.pointer) {
    return '\0';
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 5) break;
    uVar1 = uVar2 + 1;
  } while (*(int *)((long)key1.pointer + uVar2 * 4 + 4) ==
           *(int *)((long)key2.pointer + uVar2 * 4 + 4));
  return 4 < uVar2;
}

Assistant:

UBool ScriptSet::operator == (const ScriptSet &other) const {
    for (uint32_t i=0; i<UPRV_LENGTHOF(bits); i++) {
        if (bits[i] != other.bits[i]) {
            return FALSE;
        }
    }
    return TRUE;
}